

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::torrent_log_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,torrent_log_alert *this)

{
  char *__rhs;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  torrent_log_alert *local_18;
  torrent_log_alert *this_local;
  
  local_18 = this;
  this_local = (torrent_log_alert *)__return_storage_ptr__;
  torrent_alert::message_abi_cxx11_(&local_58,&this->super_torrent_alert);
  std::operator+(&local_38,&local_58,": ");
  __rhs = log_message(this);
  std::operator+(__return_storage_ptr__,&local_38,__rhs);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string torrent_log_alert::message() const
	{
		return torrent_alert::message() + ": " + log_message();
	}